

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

bool __thiscall
testing::internal::OnCallSpec<bool_(const_solitaire::archivers::interfaces::Snapshot_&)>::Matches
          (OnCallSpec<bool_(const_solitaire::archivers::interfaces::Snapshot_&)> *this,
          ArgumentTuple *args)

{
  bool bVar1;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<solitaire::archivers::interfaces::Snapshot_const&>>,std::tuple<solitaire::archivers::interfaces::Snapshot_const&>>
                    ((tuple<testing::Matcher<const_solitaire::archivers::interfaces::Snapshot_&>_> *
                     )(this + 0x10),args);
  if (bVar1) {
    bVar1 = MatcherBase<const_std::tuple<const_solitaire::archivers::interfaces::Snapshot_&>_&>::
            Matches((MatcherBase<const_std::tuple<const_solitaire::archivers::interfaces::Snapshot_&>_&>
                     *)(this + 0x28),args);
    return bVar1;
  }
  return false;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }